

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[33],char[15],unsigned_int,char[16],unsigned_long,char[22],unsigned_int,char[47]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [15],
          uint *Args_2,char (*Args_3) [16],unsigned_long *Args_4,char (*Args_5) [22],uint *Args_6,
          char (*Args_7) [47])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[15],unsigned_int,char[16],unsigned_long,char[22],unsigned_int,char[47]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [33])this,(char (*) [15])Args,(uint *)Args_1,(char (*) [16])Args_2,
             (unsigned_long *)Args_3,(char (*) [22])Args_4,(uint *)Args_5,(char (*) [47])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}